

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O0

Fl_Bitmask fl_create_alphamask(int w,int h,int d,int ld,uchar *array)

{
  int iVar1;
  uchar *data;
  Fl_Bitmask FVar2;
  uint local_58;
  uint local_54;
  int y;
  int x;
  uchar *dataptr;
  byte *pbStack_40;
  uchar bit;
  uchar *bitptr;
  uchar *bitmap;
  int bmw;
  Fl_Bitmask bm;
  uchar *array_local;
  int ld_local;
  int d_local;
  int h_local;
  int w_local;
  
  iVar1 = (w + 7) / 8;
  data = (uchar *)operator_new__((long)(iVar1 * h));
  memset(data,0,(long)(iVar1 * h));
  _y = array + (long)d + -1;
  for (local_58 = 0; (int)local_58 < h; local_58 = local_58 + 1) {
    pbStack_40 = data + (int)(local_58 * iVar1);
    dataptr._7_1_ = 1;
    for (local_54 = 0; (int)local_54 < w; local_54 = local_54 + 1) {
      if (fl_create_alphamask::dither[(int)(local_54 & 0xf)][(int)(local_58 & 0xf)] < *_y) {
        *pbStack_40 = *pbStack_40 | dataptr._7_1_;
      }
      if (dataptr._7_1_ < 0x80) {
        dataptr._7_1_ = dataptr._7_1_ << 1;
      }
      else {
        dataptr._7_1_ = 1;
        pbStack_40 = pbStack_40 + 1;
      }
      _y = _y + d;
    }
    _y = _y + ld;
  }
  FVar2 = fl_create_bitmask(w,h,data);
  if (data != (uchar *)0x0) {
    operator_delete__(data);
  }
  return FVar2;
}

Assistant:

Fl_Bitmask fl_create_alphamask(int w, int h, int d, int ld, const uchar *array) {
  Fl_Bitmask bm;
  int bmw = (w + 7) / 8;
  uchar *bitmap = new uchar[bmw * h];
  uchar *bitptr, bit;
  const uchar *dataptr;
  int x, y;
  static uchar dither[16][16] = { // Simple 16x16 Floyd dither
    { 0,   128, 32,  160, 8,   136, 40,  168,
      2,   130, 34,  162, 10,  138, 42,  170 },
    { 192, 64,  224, 96,  200, 72,  232, 104,
      194, 66,  226, 98,  202, 74,  234, 106 },
    { 48,  176, 16,  144, 56,  184, 24,  152,
      50,  178, 18,  146, 58,  186, 26,  154 },
    { 240, 112, 208, 80,  248, 120, 216, 88,
      242, 114, 210, 82,  250, 122, 218, 90 },
    { 12,  140, 44,  172, 4,   132, 36,  164,
      14,  142, 46,  174, 6,   134, 38,  166 },
    { 204, 76,  236, 108, 196, 68,  228, 100,
      206, 78,  238, 110, 198, 70,  230, 102 },
    { 60,  188, 28,  156, 52,  180, 20,  148,
      62,  190, 30,  158, 54,  182, 22,  150 },
    { 252, 124, 220, 92,  244, 116, 212, 84,
      254, 126, 222, 94,  246, 118, 214, 86 },
    { 3,   131, 35,  163, 11,  139, 43,  171,
      1,   129, 33,  161, 9,   137, 41,  169 },
    { 195, 67,  227, 99,  203, 75,  235, 107,
      193, 65,  225, 97,  201, 73,  233, 105 },
    { 51,  179, 19,  147, 59,  187, 27,  155,
      49,  177, 17,  145, 57,  185, 25,  153 },
    { 243, 115, 211, 83,  251, 123, 219, 91,
      241, 113, 209, 81,  249, 121, 217, 89 },
    { 15,  143, 47,  175, 7,   135, 39,  167,
      13,  141, 45,  173, 5,   133, 37,  165 },
    { 207, 79,  239, 111, 199, 71,  231, 103,
      205, 77,  237, 109, 197, 69,  229, 101 },
    { 63,  191, 31,  159, 55,  183, 23,  151,
      61,  189, 29,  157, 53,  181, 21,  149 },
    { 254, 127, 223, 95,  247, 119, 215, 87,
      253, 125, 221, 93,  245, 117, 213, 85 }
  };

  // Generate a 1-bit "screen door" alpha mask; not always pretty, but
  // definitely fast...  In the future we may be able to support things
  // like the RENDER extension in XFree86, when available, to provide
  // true RGBA-blended rendering.  See:
  //
  //     http://www.xfree86.org/~keithp/render/protocol.html
  //
  // for more info on XRender...
  //
  // MacOS already provides alpha blending support and has its own
  // fl_create_alphamask() function...
  memset(bitmap, 0, bmw * h);

  for (dataptr = array + d - 1, y = 0; y < h; y ++, dataptr += ld)
    for (bitptr = bitmap + y * bmw, bit = 1, x = 0; x < w; x ++, dataptr += d) {
      if (*dataptr > dither[x & 15][y & 15])
	*bitptr |= bit;
      if (bit < 128) bit <<= 1;
      else {
	bit = 1;
	bitptr ++;
      }
    }

  bm = fl_create_bitmask(w, h, bitmap);
  delete[] bitmap;

  return (bm);
}